

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O2

Var BailOutRecord::BailOutCommon
              (JavascriptCallStackLayout *layout,BailOutRecord *bailOutRecord,uint32 bailOutOffset,
              void *returnAddress,BailOutKind bailOutKind,ImplicitCallFlags savedImplicitCallFlags,
              Var branchValue,BailOutReturnValue *bailOutReturnValue,void *argoutRestoreAddress)

{
  Var pvVar1;
  ScriptFunction *function;
  Var local_1c8;
  Var registerSaves [49];
  
  js_memcpy_s(&local_1c8,0x188,
              *(void **)(*(long *)(*(long *)(*(long *)(*(long *)(*(long *)layout + 8) + 8) + 0x490)
                                  + 0x3b8) + 0xa80),0x188);
  pvVar1 = BailOutCommonNoCodeGen
                     (layout,bailOutRecord,bailOutOffset,returnAddress,bailOutKind,branchValue,
                      &local_1c8,bailOutReturnValue,argoutRestoreAddress);
  function = Js::VarTo<Js::ScriptFunction,Js::JavascriptFunction>(*(JavascriptFunction **)layout);
  ScheduleFunctionCodeGen
            (function,(ScriptFunction *)0x0,bailOutRecord,bailOutKind,bailOutOffset,
             savedImplicitCallFlags,returnAddress);
  return pvVar1;
}

Assistant:

Js::Var
BailOutRecord::BailOutCommon(Js::JavascriptCallStackLayout * layout, BailOutRecord const * bailOutRecord,
uint32 bailOutOffset, void * returnAddress, IR::BailOutKind bailOutKind, Js::ImplicitCallFlags savedImplicitCallFlags, Js::Var branchValue, BailOutReturnValue * bailOutReturnValue, void * argoutRestoreAddress)
{
    // Do not remove the following code.
    // Need to capture the int registers on stack as threadContext->bailOutRegisterSaveSpace is allocated from ThreadAlloc and is not scanned by recycler.
    // We don't want to save float (xmm) registers as they can be huge and they cannot contain a var.
    // However, we're somewhat stuck. We need to keep the references around until we restore values, but
    // we don't have a use for them. The easiest solution is to simply pass this into the corresponding
    // parameter for BailOutcommonNoCodeGen, but that requires us to save all of the vars, not just the
    // int ones. This is ultimately significantly more predictable than attempting to manage the lifetimes
    // in some other way though. We can't just do what we were doing previously, which is saving values
    // here and not passing them into BailOutCommonNoCodeGen, because then the compiler will likely get
    // rid of the memcpy and then the dead registerSaves array, since it can figure out that there's no
    // side effect (due to the GC not being something that the optimizer can, or should, reason about).
    Js::Var registerSaves[BailOutRegisterSaveSlotCount];
    js_memcpy_s(registerSaves, sizeof(registerSaves), (Js::Var *)layout->functionObject->GetScriptContext()->GetThreadContext()->GetBailOutRegisterSaveSpace(),
        sizeof(registerSaves));

    Js::Var result = BailOutCommonNoCodeGen(layout, bailOutRecord, bailOutOffset, returnAddress, bailOutKind, branchValue, registerSaves, bailOutReturnValue, argoutRestoreAddress);
    ScheduleFunctionCodeGen(Js::VarTo<Js::ScriptFunction>(layout->functionObject), nullptr, bailOutRecord, bailOutKind, bailOutOffset, savedImplicitCallFlags, returnAddress);
    return result;
}